

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall ON_ColorValue::ReportHelper(ON_ColorValue *this,ON_TextLog *text_log)

{
  ON_TextLog *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar5;
  int local_20;
  int count;
  int i;
  ON_Color c;
  ON_TextLog *text_log_local;
  ON_ColorValue *this_local;
  
  _i = text_log;
  ON_Color::ON_Color((ON_Color *)&count);
  ON_TextLog::Print(_i,"color value\n");
  ON_TextLog::PushIndent(_i);
  iVar1 = ON_SimpleArray<ON_Color>::Count(&this->m_value);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    paVar5 = &ON_SimpleArray<ON_Color>::operator[](&this->m_value,local_20)->field_0;
    this_00 = _i;
    count = paVar5->m_color;
    uVar2 = ON_Color::Red((ON_Color *)&count);
    uVar3 = ON_Color::Green((ON_Color *)&count);
    uVar4 = ON_Color::Blue((ON_Color *)&count);
    ON_TextLog::Print(this_00,"rbg(%d,%d,%d)",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  }
  ON_TextLog::PopIndent(_i);
  return true;
}

Assistant:

bool ON_ColorValue::ReportHelper(ON_TextLog& text_log ) const
{
  ON_Color c;
  text_log.Print("color value\n");
  text_log.PushIndent();
  int i, count = m_value.Count();
  for ( i = 0; i < count; i++ )
  {
    c = m_value[i];
    text_log.Print("rbg(%d,%d,%d)",c.Red(),c.Green(),c.Blue());
  }
  text_log.PopIndent();
  return true;
}